

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O3

void __thiscall QAbstractTestLogger::filterUnprintable(QAbstractTestLogger *this,char *str)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *str;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(str + 1);
    do {
      if ((bVar1 == 0x7f) || (bVar1 < 0x20 && (byte)(bVar1 - 0xb) < 0xfe)) {
        pbVar2[-1] = 0x3f;
      }
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

void QAbstractTestLogger::filterUnprintable(char *str) const
{
    unsigned char *idx = reinterpret_cast<unsigned char *>(str);
    while (*idx) {
        if (((*idx < 0x20 && *idx != '\n' && *idx != '\t') || *idx == 0x7f))
            *idx = '?';
        ++idx;
    }
}